

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O2

hash_t duckdb::Hash<double>(double val)

{
  hash_t hVar1;
  double x;
  
  if (((val != 0.0) || (x = 0.0, NAN(val))) && (x = val, NAN(val))) {
    x = NAN;
  }
  hVar1 = MurmurHash64((uint64_t)x);
  return hVar1;
}

Assistant:

hash_t Hash(double val) {
	static_assert(sizeof(double) == sizeof(uint64_t), "");
	FloatingPointEqualityTransform<double>::OP(val);
	uint64_t uval = Load<uint64_t>(const_data_ptr_cast(&val));
	return MurmurHash64(uval);
}